

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

string * glcts::anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>
                   (void)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string *in_RDI;
  undefined7 *local_30;
  undefined8 local_28;
  undefined7 local_20;
  undefined1 uStack_19;
  undefined7 uStack_18;
  undefined1 local_11;
  
  local_20 = 0x6f697372657623;
  uStack_19 = 0x6e;
  uStack_18 = 0x73652030313320;
  local_28 = 0xf;
  local_11 = 0;
  local_30 = &local_20;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar3;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT17(uStack_19,local_20) + 1);
  }
  return in_RDI;
}

Assistant:

std::string vshSimple()
{
	return api::glslVer() + NL "in vec4 i_vertex;" NL "void main()" NL "{" NL "    gl_Position = i_vertex;" NL "}";
}